

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::noteNetAlias
          (Compilation *this,Scope *scope,Symbol *firstSym,DriverBitRange firstRange,
          Expression *firstExpr,Symbol *secondSym,DriverBitRange secondRange,Expression *secondExpr)

{
  flat_hash_map<const_Symbol_*,_AliasIntervalMap> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  ulong uVar4;
  long *plVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  Compilation *pCVar8;
  bool bVar9;
  ulong pos0;
  Diagnostic *pDVar10;
  value_type_pointer ppVar11;
  ulong hash;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  unsigned_long __tmp_1;
  unsigned_long uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  Expression *firstExprPtr;
  Symbol *b;
  NetAlias *newAlias;
  iterator end;
  unsigned_long local_118;
  Expression *local_110;
  Symbol *local_108;
  Expression *local_100;
  Symbol *local_f8;
  Scope *local_f0;
  unsigned_long local_e8;
  Compilation *local_e0;
  uchar local_d8;
  uchar uStack_d7;
  uchar uStack_d6;
  byte bStack_d5;
  uchar uStack_d4;
  uchar uStack_d3;
  uchar uStack_d2;
  byte bStack_d1;
  uchar uStack_d0;
  uchar uStack_cf;
  uchar uStack_ce;
  byte bStack_cd;
  uchar uStack_cc;
  uchar uStack_cb;
  uchar uStack_ca;
  byte bStack_c9;
  overlap_iterator local_c0;
  iterator local_70;
  IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U> *this_00;
  
  local_f8 = secondSym;
  local_110 = secondExpr;
  uVar16 = firstRange.first;
  local_118 = firstRange.second;
  local_108 = firstSym;
  local_100 = firstExpr;
  if (secondSym < firstSym) {
    local_108 = secondSym;
    local_100 = secondExpr;
    local_118 = secondRange.second;
    uVar16 = secondRange.first;
    secondRange.first = firstRange.first;
    secondRange.second = firstRange.second;
    local_110 = firstExpr;
    local_f8 = firstSym;
  }
  arrays_ = &this->netAliases;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_108;
  hash = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->netAliases).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
                        .arrays.groups_size_index & 0x3f);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar11 = (this->netAliases).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
            .arrays.elements_;
  uVar4 = (this->netAliases).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
          .arrays.groups_size_mask;
  uVar12 = 0;
  uVar15 = pos0;
  do {
    pgVar2 = (this->netAliases).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
             .arrays.groups_ + uVar15;
    local_d8 = pgVar2->m[0].n;
    uStack_d7 = pgVar2->m[1].n;
    uStack_d6 = pgVar2->m[2].n;
    bStack_d5 = pgVar2->m[3].n;
    uStack_d4 = pgVar2->m[4].n;
    uStack_d3 = pgVar2->m[5].n;
    uStack_d2 = pgVar2->m[6].n;
    bStack_d1 = pgVar2->m[7].n;
    uStack_d0 = pgVar2->m[8].n;
    uStack_cf = pgVar2->m[9].n;
    uStack_ce = pgVar2->m[10].n;
    bStack_cd = pgVar2->m[0xb].n;
    uStack_cc = pgVar2->m[0xc].n;
    uStack_cb = pgVar2->m[0xd].n;
    uStack_ca = pgVar2->m[0xe].n;
    bStack_c9 = pgVar2->m[0xf].n;
    uVar17 = (uchar)uVar3;
    auVar21[0] = -(local_d8 == uVar17);
    uVar18 = (uchar)((uint)uVar3 >> 8);
    auVar21[1] = -(uStack_d7 == uVar18);
    uVar19 = (uchar)((uint)uVar3 >> 0x10);
    auVar21[2] = -(uStack_d6 == uVar19);
    bVar20 = (byte)((uint)uVar3 >> 0x18);
    auVar21[3] = -(bStack_d5 == bVar20);
    auVar21[4] = -(uStack_d4 == uVar17);
    auVar21[5] = -(uStack_d3 == uVar18);
    auVar21[6] = -(uStack_d2 == uVar19);
    auVar21[7] = -(bStack_d1 == bVar20);
    auVar21[8] = -(uStack_d0 == uVar17);
    auVar21[9] = -(uStack_cf == uVar18);
    auVar21[10] = -(uStack_ce == uVar19);
    auVar21[0xb] = -(bStack_cd == bVar20);
    auVar21[0xc] = -(uStack_cc == uVar17);
    auVar21[0xd] = -(uStack_cb == uVar18);
    auVar21[0xe] = -(uStack_ca == uVar19);
    auVar21[0xf] = -(bStack_c9 == bVar20);
    for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe); local_f0 = scope,
        local_e8 = uVar16, local_e0 = this, uVar13 != 0; uVar13 = uVar13 - 1 & uVar13) {
      uVar6 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      if (local_108 == ppVar11[uVar15 * 0xf + (ulong)uVar6].first) {
        ppVar11 = ppVar11 + uVar15 * 0xf + (ulong)uVar6;
        goto LAB_002e264a;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_c9) == 0) break;
    lVar14 = uVar15 + uVar12;
    uVar12 = uVar12 + 1;
    uVar15 = lVar14 + 1U & uVar4;
  } while (uVar12 <= uVar4);
  if ((this->netAliases).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
      .size_ctrl.size <
      (this->netAliases).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*const&>
              ((locator *)&local_c0,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>>>
                *)arrays_,(arrays_type *)arrays_,pos0,hash,(try_emplace_args_t *)&local_70,
               &local_108);
    psVar1 = &(this->netAliases).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
    ppVar11 = (value_type_pointer)
              local_c0.super_iterator.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*const&>
              ((locator *)&local_c0,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>>>
                *)arrays_,hash,(try_emplace_args_t *)&local_70,&local_108);
    ppVar11 = (value_type_pointer)
              local_c0.super_iterator.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  }
LAB_002e264a:
  this_00 = &ppVar11->second;
  IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::end(&local_70,this_00);
  IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::find
            (&local_c0,this_00,uVar16,local_118);
  do {
    bVar9 = IntervalMapDetails::Path::operator==
                      (&local_c0.super_iterator.super_const_iterator.path,
                       &local_70.super_const_iterator.path);
    if (bVar9) {
LAB_002e277f:
      if (local_c0.super_iterator.super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
          (pointer)((long)&local_c0.super_iterator.super_const_iterator.path.path.
                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry> + 0x18U)) {
        operator_delete(local_c0.super_iterator.super_const_iterator.path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
      }
      pCVar8 = local_e0;
      local_c0.super_iterator.super_const_iterator.map =
           (IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U> *)
           BumpAllocator::
           emplace<slang::ast::Compilation::NetAlias,slang::ast::Symbol_const*&,std::pair<unsigned_long,unsigned_long>&,slang::ast::Expression_const*&,slang::ast::Expression_const*&>
                     (&local_e0->super_BumpAllocator,&local_f8,&secondRange,&local_100,&local_110);
      uVar16 = local_e8;
      IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::insert
                (this_00,local_e8,local_118,(NetAlias **)&local_c0,&pCVar8->netAliasAllocator);
      if (((bVar9) && (local_108 == local_f8)) &&
         ((uVar16 <= secondRange.second && (secondRange.first <= local_118)))) {
        pDVar10 = Scope::addDiag(local_f0,(DiagCode)0x1b000d,local_100->sourceRange);
        Diagnostic::operator<<(pDVar10,local_110->sourceRange);
      }
      if (local_70.super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
          (pointer)local_70.super_const_iterator.path.path.
                   super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement) {
        operator_delete(local_70.super_const_iterator.path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
      }
      return;
    }
    plVar5 = *(long **)((long)local_c0.super_iterator.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                              [(long)((long)&(((value_type_pointer)
                                              (local_c0.super_iterator.super_const_iterator.path.
                                               path.
                                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                               .len + -0xd0))->second).rootSize + 3)].node +
                       (ulong)local_c0.super_iterator.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                              [(long)((long)&(((value_type_pointer)
                                              (local_c0.super_iterator.super_const_iterator.path.
                                               path.
                                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                               .len + -0xd0))->second).rootSize + 3)].offset * 8 +
                       0x80);
    if ((((Symbol *)*plVar5 == local_f8) && ((ulong)plVar5[1] <= secondRange.second)) &&
       (secondRange.first <= (ulong)plVar5[2])) {
      if ((Symbol *)*plVar5 == local_108) {
        pDVar10 = Scope::addDiag(local_f0,(DiagCode)0x1b000d,local_100->sourceRange);
        Diagnostic::operator<<(pDVar10,local_110->sourceRange);
      }
      else {
        pDVar10 = Scope::addDiag(local_f0,(DiagCode)0x18000d,local_100->sourceRange);
        Diagnostic::addNote(pDVar10,(DiagCode)0x27000d,local_110->sourceRange);
        Diagnostic::addNote(pDVar10,(DiagCode)0x26000d,*(SourceRange *)(plVar5[3] + 0x20));
        Diagnostic::addNote(pDVar10,(DiagCode)0x27000d,*(SourceRange *)(plVar5[4] + 0x20));
      }
      goto LAB_002e277f;
    }
    IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::overlap_iterator::
    operator++(&local_c0);
  } while( true );
}

Assistant:

void Compilation::noteNetAlias(const Scope& scope, const Symbol& firstSym,
                               DriverBitRange firstRange, const Expression& firstExpr,
                               const Symbol& secondSym, DriverBitRange secondRange,
                               const Expression& secondExpr) {
    SLANG_ASSERT(!isFrozen());
    SLANG_ASSERT(firstRange.second - firstRange.first == secondRange.second - secondRange.first);

    auto overlaps = [](DriverBitRange a, DriverBitRange b) {
        return a.first <= b.second && b.first <= a.second;
    };

    const Symbol* a = &firstSym;
    const Symbol* b = &secondSym;
    const Expression* firstExprPtr = &firstExpr;
    const Expression* secondExprPtr = &secondExpr;
    if (a > b) {
        std::swap(a, b);
        std::swap(firstRange, secondRange);
        std::swap(firstExprPtr, secondExprPtr);
    }

    bool errored = false;
    auto& imap = netAliases[a];
    const auto end = imap.end();
    for (auto it = imap.find(firstRange); it != end; ++it) {
        auto curr = *it;
        if (curr->sym == b && overlaps(curr->range, secondRange)) {
            errored = true;
            if (curr->sym == a) {
                scope.addDiag(diag::NetAliasSelf, firstExprPtr->sourceRange)
                    << secondExprPtr->sourceRange;
            }
            else {
                auto& diag = scope.addDiag(diag::MultipleNetAlias, firstExprPtr->sourceRange);
                diag.addNote(diag::NoteAliasedTo, secondExprPtr->sourceRange);
                diag.addNote(diag::NoteAliasDeclaration, curr->firstExpr->sourceRange);
                diag.addNote(diag::NoteAliasedTo, curr->secondExpr->sourceRange);
            }
            break;
        }
    }

    auto newAlias = emplace<NetAlias>(b, secondRange, firstExprPtr, secondExprPtr);
    imap.insert(firstRange, newAlias, netAliasAllocator);

    if (!errored && a == b && overlaps(firstRange, secondRange)) {
        scope.addDiag(diag::NetAliasSelf, firstExprPtr->sourceRange) << secondExprPtr->sourceRange;
    }
}